

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  int iVar1;
  int iVar2;
  Type TVar3;
  char *pcVar4;
  Message *pMVar5;
  TestPartResult *val;
  AssertionResult *pAVar6;
  char *__needle;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined4 in_register_00000084;
  AssertionResult AVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  AssertionResult local_c0;
  AssertionResult local_b0;
  TestPartResult *local_a0;
  TestPartResult *r;
  AssertionResult local_90;
  int local_80;
  int local_7c;
  int i;
  Message msg;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string expected;
  Type type_local;
  TestPartResultArray *results_local;
  char *param_2_local;
  char *param_1_local;
  char *param_0_local;
  
  expected.field_2._12_4_ = SUB84(substr,0);
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar4 = "1 non-fatal failure";
  if (expected.field_2._12_4_ == 2) {
    pcVar4 = "1 fatal failure";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar4,&local_59);
  std::allocator<char>::~allocator(&local_59);
  Message::Message((Message *)&i);
  iVar1 = TestPartResultArray::size(this);
  if (iVar1 == 1) {
    local_a0 = TestPartResultArray::GetTestPartResult(this,0);
    TVar3 = TestPartResult::type(local_a0);
    if (TVar3 == expected.field_2._12_4_) {
      pcVar4 = TestPartResult::message(local_a0);
      __needle = (char *)std::__cxx11::string::c_str();
      pcVar4 = strstr(pcVar4,__needle);
      if (pcVar4 == (char *)0x0) {
        AssertionFailure();
        pAVar6 = AssertionResult::operator<<(&local_c0,(char (*) [11])0x16baf3);
        pAVar6 = AssertionResult::operator<<
                           (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [14])" containing \"");
        pAVar6 = AssertionResult::operator<<(pAVar6,in_stack_00000008);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [3])0x16c6a5);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
        pAVar6 = AssertionResult::operator<<(pAVar6,local_a0);
        AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar6);
        AssertionResult::~AssertionResult(&local_c0);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      pAVar6 = AssertionResult::operator<<(&local_b0,(char (*) [11])0x16baf3);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_58);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [2])0x16c280);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,local_a0);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar6);
      AssertionResult::~AssertionResult(&local_b0);
    }
  }
  else {
    pMVar5 = Message::operator<<((Message *)&i,(char (*) [11])0x16baf3);
    pMVar5 = Message::operator<<(pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_58);
    pMVar5 = Message::operator<<(pMVar5,(char (*) [2])0x16c280);
    pMVar5 = Message::operator<<(pMVar5,(char (*) [11])0x16bae7);
    local_7c = TestPartResultArray::size(this);
    pMVar5 = Message::operator<<(pMVar5,&local_7c);
    Message::operator<<(pMVar5,(char (*) [10])" failures");
    local_80 = 0;
    while( true ) {
      iVar1 = local_80;
      iVar2 = TestPartResultArray::size(this);
      if (iVar2 <= iVar1) break;
      pMVar5 = Message::operator<<((Message *)&i,(char (*) [2])0x16c280);
      val = TestPartResultArray::GetTestPartResult(this,local_80);
      Message::operator<<(pMVar5,val);
      local_80 = local_80 + 1;
    }
    AssertionFailure();
    pAVar6 = AssertionResult::operator<<(&local_90,(Message *)&i);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar6);
    AssertionResult::~AssertionResult(&local_90);
  }
  r._4_4_ = 1;
  Message::~Message((Message *)&i);
  std::__cxx11::string::~string((string *)local_58);
  AVar7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar7._0_8_ = param_1;
  return AVar7;
}

Assistant:

static AssertionResult HasOneFailure(const char* /* results_expr */,
                                     const char* /* type_expr */,
                                     const char* /* substr_expr */,
                                     const TestPartResultArray& results,
                                     TestPartResult::Type type,
                                     const std::string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure
                                 ? "1 fatal failure"
                                 : "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == nullptr) {
    return AssertionFailure()
           << "Expected: " << expected << " containing \"" << substr << "\"\n"
           << "  Actual:\n"
           << r;
  }

  return AssertionSuccess();
}